

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

QSize __thiscall QDockWidgetLayout::maximumSize(QDockWidgetLayout *this)

{
  long lVar1;
  const_reference ppQVar2;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  QSize *in_stack_00000008;
  QDockWidgetLayout *in_stack_00000010;
  QSize content;
  qsizetype in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffd0;
  QSize local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppQVar2 = QList<QLayoutItem_*>::operator[]
                      ((QList<QLayoutItem_*> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*ppQVar2 == (QLayoutItem *)0x0) {
    QLayout::parentWidget((QLayout *)in_RDI);
    local_18 = QWidget::maximumSize(in_RDI);
  }
  else {
    ppQVar2 = QList<QLayoutItem_*>::operator[]
                        ((QList<QLayoutItem_*> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8
                        );
    (*(*ppQVar2)->_vptr_QLayoutItem[4])();
    QLayout::parentWidget((QLayout *)in_RDI);
    QWidget::isWindow(in_stack_ffffffffffffffd0);
    local_18 = sizeFromContent(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetLayout::maximumSize() const
{
    if (item_list[Content] != 0) {
        const QSize content = item_list[Content]->maximumSize();
        return sizeFromContent(content, parentWidget()->isWindow());
    } else {
        return parentWidget()->maximumSize();
    }

}